

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O2

IVec2 __thiscall
deqp::egl::checkSurfaceSize
          (egl *this,Library *egl,EGLDisplay eglDisplay,EGLSurface eglSurface,
          NativeWindow *nativeWindow,IVec2 *reqSize,ResultCollector *status)

{
  undefined4 uVar1;
  int iVar2;
  ostream *poVar3;
  undefined1 auVar4 [16];
  IVec2 nativeSize;
  ostringstream oss;
  Vector<int,_2> local_200;
  int local_1f8 [2];
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  string local_1d0;
  Vector<int,_2> local_1b0;
  ostringstream local_1a8 [376];
  
  tcu::Vector<int,_2>::Vector(&local_1b0,reqSize);
  getNativeSurfaceSize((egl *)&local_200,nativeWindow,&local_1b0);
  eglu::getSurfaceSize((eglu *)this,egl,eglDisplay,eglSurface);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar3 = std::operator<<((ostream *)local_1a8,"Size of EGL surface ");
  poVar3 = tcu::operator<<(poVar3,(Vector<int,_2> *)this);
  poVar3 = std::operator<<(poVar3," differs from size of native window ");
  tcu::operator<<(poVar3,&local_200);
  local_1e8 = *(undefined8 *)this;
  uStack_1e0 = 0;
  local_1f8[0] = local_200.m_data[0];
  local_1f8[1] = local_200.m_data[1];
  uStack_1f0 = 0;
  uVar1 = std::__cxx11::stringbuf::str();
  auVar4._0_4_ = -(uint)((int)local_1e8 == local_1f8[0]);
  auVar4._4_4_ = auVar4._0_4_;
  auVar4._8_4_ = -(uint)(local_1e8._4_4_ == local_1f8[1]);
  auVar4._12_4_ = -(uint)(local_1e8._4_4_ == local_1f8[1]);
  iVar2 = movmskpd(uVar1,auVar4);
  tcu::ResultCollector::check((ResultCollector *)nativeSize.m_data,iVar2 == 3,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return (IVec2)(int  [2])this;
}

Assistant:

IVec2 checkSurfaceSize (const Library&		egl,
						EGLDisplay			eglDisplay,
						EGLSurface			eglSurface,
						const NativeWindow&	nativeWindow,
						IVec2				reqSize,
						ResultCollector&	status)
{
	const IVec2		nativeSize	= getNativeSurfaceSize(nativeWindow, reqSize);
	IVec2			eglSize		= eglu::getSurfaceSize(egl, eglDisplay, eglSurface);
	ostringstream	oss;

	oss << "Size of EGL surface " << eglSize
		<< " differs from size of native window " << nativeSize;
	status.check(eglSize == nativeSize, oss.str());

	return eglSize;
}